

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equal_suite.cpp
# Opt level: O0

void test_array_wstring(void)

{
  size_type in_RCX;
  size_type sVar1;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_01;
  basic_variable<std::allocator<char>_> *local_3f0;
  basic_variable<std::allocator<char>_> *local_3d0;
  basic_variable<std::allocator<char>_> *local_3b0;
  undefined1 local_3a1;
  iterator local_3a0;
  iterator local_388;
  iterator local_370;
  undefined1 local_352 [2];
  basic_variable<std::allocator<char>_> *local_350;
  basic_variable<std::allocator<char>_> local_348;
  basic_variable<std::allocator<char>_> local_318;
  basic_variable<std::allocator<char>_> local_2e8;
  undefined1 local_2b8 [24];
  variable charlie;
  iterator local_270;
  iterator local_258;
  iterator local_240;
  undefined1 local_222 [2];
  basic_variable<std::allocator<char>_> *local_220;
  basic_variable<std::allocator<char>_> local_218;
  basic_variable<std::allocator<char>_> local_1e8;
  basic_variable<std::allocator<char>_> local_1b8;
  undefined1 local_188 [24];
  variable bravo;
  undefined1 local_139;
  iterator local_138;
  iterator local_120;
  iterator local_108;
  undefined1 local_ee [14];
  basic_variable<std::allocator<char>_> *local_e0;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable alpha;
  
  local_e0 = &local_d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_e0,L"alpha");
  local_e0 = &local_a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_e0,L"alpha");
  local_e0 = &local_78;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_e0,L"alpha");
  local_48._0_8_ = &local_d8;
  local_48._8_8_ = 3;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  local_3b0 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_3b0 = local_3b0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_3b0);
  } while (local_3b0 != &local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_108,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_120,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_138,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_ee[0] = std::
                equal<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                          (&local_108,&local_120,&local_138);
  local_139 = 1;
  sVar1 = 0xa7;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::equal(alpha.begin(), alpha.end(), alpha.begin())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/equal_suite.cpp"
             ,0xa7,"void test_array_wstring()",local_ee,&local_139);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_138);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_120);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_108);
  local_220 = &local_218;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_220,L"bravo");
  local_220 = &local_1e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_220,L"alpha");
  local_220 = &local_1b8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_220,L"alpha");
  local_188._0_8_ = &local_218;
  local_188._8_8_ = 3;
  init_00._M_len = sVar1;
  init_00._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_188 + 0x10),
             (basic_array<std::allocator<char>_> *)local_188._0_8_,init_00);
  local_3d0 = (basic_variable<std::allocator<char>_> *)local_188;
  do {
    local_3d0 = local_3d0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_3d0);
  } while (local_3d0 != &local_218);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_240,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_258,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_270,(basic_variable<std::allocator<char>_> *)(local_188 + 0x10));
  local_222[0] = std::
                 equal<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_240,&local_258,&local_270);
  charlie.storage._47_1_ = 0;
  sVar1 = 0xaa;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::equal(alpha.begin(), alpha.end(), bravo.begin())","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/equal_suite.cpp"
             ,0xaa,"void test_array_wstring()",local_222,&charlie.storage.field_0x2f);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_270);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_258);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_240);
  local_350 = &local_348;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_350,L"bravo");
  local_350 = &local_318;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_350,L"bravo");
  local_350 = &local_2e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_350,L"bravo");
  local_2b8._0_8_ = &local_348;
  local_2b8._8_8_ = 3;
  init_01._M_len = sVar1;
  init_01._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_2b8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_2b8._0_8_,init_01);
  local_3f0 = (basic_variable<std::allocator<char>_> *)local_2b8;
  do {
    local_3f0 = local_3f0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_3f0);
  } while (local_3f0 != &local_348);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_370,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_388,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_3a0,(basic_variable<std::allocator<char>_> *)(local_2b8 + 0x10));
  local_352[0] = std::
                 equal<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                           (&local_370,&local_388,&local_3a0);
  local_3a1 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::equal(alpha.begin(), alpha.end(), charlie.begin())","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/equal_suite.cpp"
             ,0xad,"void test_array_wstring()",local_352,&local_3a1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3a0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_388);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_370);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_2b8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_188 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void test_array_wstring()
{
    variable alpha = array::make({ L"alpha", L"alpha", L"alpha" });
    TRIAL_PROTOCOL_TEST_EQUAL(std::equal(alpha.begin(), alpha.end(), alpha.begin()),
                              true);
    variable bravo = array::make({ L"bravo", L"alpha", L"alpha" });
    TRIAL_PROTOCOL_TEST_EQUAL(std::equal(alpha.begin(), alpha.end(), bravo.begin()),
                              false);
    variable charlie = array::make({ L"bravo", L"bravo", L"bravo" });
    TRIAL_PROTOCOL_TEST_EQUAL(std::equal(alpha.begin(), alpha.end(), charlie.begin()),
                              false);
}